

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O3

btScalar btEpsRoot(void)

{
  float fVar1;
  
  if (btEpsRoot()::alreadyCalculated != '\x01') {
    if (btMachEps()::calculated == '\0') {
      do {
        do {
          btMachEps::machEps = btMachEps::machEps * 0.5;
          fVar1 = btMachEps::machEps * 0.5 + 1.0;
        } while (fVar1 != 1.0);
      } while (NAN(fVar1));
      btMachEps()::calculated = '\x01';
    }
    if (btMachEps::machEps < 0.0) {
      btEpsRoot::epsroot = sqrtf(btMachEps::machEps);
    }
    else {
      btEpsRoot::epsroot = SQRT(btMachEps::machEps);
    }
    btEpsRoot()::alreadyCalculated = 1;
    return btEpsRoot::epsroot;
  }
  return btEpsRoot::epsroot;
}

Assistant:

btScalar btEpsRoot() {
	
	static btScalar epsroot = 0.;
	static bool alreadyCalculated = false;
	
	if (!alreadyCalculated) {
		epsroot = btSqrt(btMachEps());
		alreadyCalculated = true;
	}
	return epsroot;
}